

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O0

float Gia_ManLevelAve(Gia_Man_t *p)

{
  int iVar1;
  bool bVar2;
  int local_20;
  int local_1c;
  int Ave;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *p_local;
  
  local_20 = 0;
  if (p->vLevels != (Vec_Int_t *)0x0) {
    local_1c = 0;
    while( true ) {
      iVar1 = Vec_IntSize(p->vCos);
      bVar2 = false;
      if (local_1c < iVar1) {
        _Ave = Gia_ManCo(p,local_1c);
        bVar2 = _Ave != (Gia_Obj_t *)0x0;
      }
      if (!bVar2) break;
      iVar1 = Gia_ObjLevel(p,_Ave);
      local_20 = iVar1 + local_20;
      local_1c = local_1c + 1;
    }
    iVar1 = Gia_ManCoNum(p);
    return (float)local_20 / (float)iVar1;
  }
  __assert_fail("p->vLevels",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaUtil.c"
                ,0x211,"float Gia_ManLevelAve(Gia_Man_t *)");
}

Assistant:

float Gia_ManLevelAve( Gia_Man_t * p )  
{
    Gia_Obj_t * pObj;
    int i, Ave = 0;
    assert( p->vLevels );
    Gia_ManForEachCo( p, pObj, i )
        Ave += Gia_ObjLevel(p, pObj);
    return (float)Ave / Gia_ManCoNum(p);
}